

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderRaceTime(CHud *this,CNetObj_PlayerInfoRace *pRaceInfo)

{
  int iVar1;
  int iVar2;
  int a;
  ITextRender *pIVar3;
  IClient *pIVar4;
  IGraphics *pIVar5;
  int *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  float fVar6;
  float Half;
  int RaceTime;
  float TimeWidth;
  CQuadItem QuadItem;
  char aBuf [32];
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined1 *puVar7;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 *puVar8;
  undefined4 in_stack_ffffffffffffff80;
  CQuadItem local_3c;
  uint local_2c;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI != (int *)0x0) && (*in_RSI != -1)) {
    puVar7 = local_28;
    iVar1 = CGameClient::RacePrecision(*(CGameClient **)(in_RDI + 8));
    minimum<int>(iVar1,1);
    FormatTime((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int)in_stack_ffffffffffffff5c,(int)in_stack_ffffffffffffff58,0);
    pIVar3 = CComponent::TextRender((CComponent *)0x16938b);
    (*(pIVar3->super_IInterface)._vptr_IInterface[6])(0x41400000,pIVar3,local_28,0xffffffff);
    pIVar4 = CComponent::Client((CComponent *)0x1693b9);
    iVar1 = IClient::GameTick(pIVar4);
    iVar1 = (iVar1 - *in_RSI) * 1000;
    pIVar4 = CComponent::Client((CComponent *)0x1693dc);
    iVar2 = IClient::GameTickSpeed(pIVar4);
    iVar2 = iVar1 / iVar2;
    puVar8 = local_28;
    a = CGameClient::RacePrecision(*(CGameClient **)(in_RDI + 8));
    minimum<int>(a,1);
    FormatTime((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int)in_stack_ffffffffffffff5c,(int)in_stack_ffffffffffffff58,0);
    CComponent::Graphics((CComponent *)0x169441);
    fVar6 = IGraphics::ScreenAspect
                      ((IGraphics *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    pIVar5 = CComponent::Graphics((CComponent *)0x169474);
    local_2c = g_pData->m_aImages[0x1a].m_Id.m_Id;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_2c);
    pIVar5 = CComponent::Graphics((CComponent *)0x1694a6);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
    CComponent::RenderTools((CComponent *)0x1694bc);
    CRenderTools::SelectSprite
              ((CRenderTools *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
               (int)((ulong)puVar7 >> 0x20),(int)puVar7,in_stack_ffffffffffffff64,
               in_stack_ffffffffffffff60);
    IGraphics::CQuadItem::CQuadItem
              (&local_3c,((fVar6 * 300.0) / 2.0 - extraout_XMM0_Da / 2.0) - 18.0,20.0,15.0,15.0);
    pIVar5 = CComponent::Graphics((CComponent *)0x169521);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])(pIVar5,&local_3c,1);
    pIVar5 = CComponent::Graphics((CComponent *)0x169541);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
    if ((RenderRaceTime(CNetObj_PlayerInfoRace_const*)::s_Cursor == '\0') &&
       (iVar1 = __cxa_guard_acquire(&RenderRaceTime(CNetObj_PlayerInfoRace_const*)::s_Cursor),
       iVar1 != 0)) {
      CTextCursor::CTextCursor
                ((CTextCursor *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
                 (float)((ulong)puVar8 >> 0x20),(int)puVar8);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderRaceTime::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderRaceTime(CNetObj_PlayerInfoRace_const*)::s_Cursor);
    }
    CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                        ,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    pIVar3 = CComponent::TextRender((CComponent *)0x1695f2);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
              (pIVar3,&RenderRaceTime::s_Cursor,local_28,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderRaceTime(const CNetObj_PlayerInfoRace *pRaceInfo)
{
	if(!pRaceInfo || pRaceInfo->m_RaceStartTick == -1)
		return;

	char aBuf[32];

	FormatTime(aBuf, sizeof(aBuf), 0, minimum(m_pClient->RacePrecision(), 1));
	float TimeWidth = TextRender()->TextWidth(12, aBuf, -1);

	int RaceTime = (Client()->GameTick() - pRaceInfo->m_RaceStartTick)*1000/Client()->GameTickSpeed();
	FormatTime(aBuf, sizeof(aBuf), RaceTime, minimum(m_pClient->RacePrecision(), 1));

	float Half = 300.0f*Graphics()->ScreenAspect()/2.0f;

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_TIMERCLOCK].m_Id);
	Graphics()->QuadsBegin();
	RenderTools()->SelectSprite(SPRITE_TIMERCLOCK_A);
	IGraphics::CQuadItem QuadItem(Half-TimeWidth/2-18.f, 20, 15, 15);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	static CTextCursor s_Cursor(12);
	s_Cursor.Reset();
	s_Cursor.MoveTo(Half-TimeWidth/2, 20);
	TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
}